

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::NetworkUpdateParameters::MergePartialFromCodedStream
          (NetworkUpdateParameters *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  Type *this_00;
  Int64Parameter *pIVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  BoolParameter *this_01;
  ulong extraout_RAX_01;
  Optimizer *this_02;
  ulong extraout_RAX_02;
  pair<int,_int> pVar8;
  char cVar9;
  uint uVar10;
  int byte_limit;
  ulong uVar11;
  int iVar12;
  int local_64;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar10, (~(uint)*pbVar1 & uVar10) < 0x80))
        goto LAB_0023fedf;
        uVar11 = (ulong)((uVar10 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_0023fedf:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar6 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto switchD_0023fd0b_caseD_4;
    uVar10 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar11;
    switch(uVar10) {
    case 1:
      if (cVar9 != '\n') break;
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (&(this->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar5 = true;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < byte_limit;
      }
      iVar12 = 6;
      if ((((!bVar5) ||
           (pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,byte_limit), (long)pVar8 < 0)) ||
          (bVar5 = LossLayer::MergePartialFromCodedStream(this_00,input), !bVar5)) ||
         (bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar8.first), !bVar5)) goto LAB_0023fce9;
      goto LAB_0023fce6;
    case 2:
      if (cVar9 != '\x12') break;
      if (this->optimizer_ == (Optimizer *)0x0) {
        this_02 = (Optimizer *)operator_new(0x20);
        Optimizer::Optimizer(this_02);
        this->optimizer_ = this_02;
      }
      MergePartialFromCodedStream();
      uVar11 = extraout_RAX_02;
LAB_0023fe64:
      iVar12 = local_64;
      if ((uVar11 & 1) == 0) goto LAB_0023fce6;
      goto LAB_0023fce9;
    case 3:
      if (cVar9 == '\x1a') {
        if (this->epochs_ == (Int64Parameter *)0x0) {
          pIVar7 = (Int64Parameter *)operator_new(0x28);
          Int64Parameter::Int64Parameter(pIVar7);
          this->epochs_ = pIVar7;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_00;
        goto LAB_0023fe64;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
      break;
    case 10:
      if (cVar9 == 'R') {
        if (this->shuffle_ == (BoolParameter *)0x0) {
          this_01 = (BoolParameter *)operator_new(0x18);
          BoolParameter::BoolParameter(this_01);
          this->shuffle_ = this_01;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX_01;
        goto LAB_0023fe64;
      }
      break;
    default:
      if ((uVar10 == 0x14) && (cVar9 == -0x5e)) {
        if (this->seed_ == (Int64Parameter *)0x0) {
          pIVar7 = (Int64Parameter *)operator_new(0x28);
          Int64Parameter::Int64Parameter(pIVar7);
          this->seed_ = pIVar7;
        }
        MergePartialFromCodedStream();
        uVar11 = extraout_RAX;
        goto LAB_0023fe64;
      }
    }
switchD_0023fd0b_caseD_4:
    iVar12 = 7;
    if ((uVar6 & 7) != 4 && uVar6 != 0) {
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
      if (bVar5) {
LAB_0023fce6:
        iVar12 = 0;
      }
      else {
        iVar12 = 6;
      }
    }
LAB_0023fce9:
    if (iVar12 != 0) {
      return iVar12 != 6;
    }
  } while( true );
}

Assistant:

bool NetworkUpdateParameters::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NetworkUpdateParameters)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.LossLayer lossLayers = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_losslayers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Optimizer optimizer = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_optimizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter epochs = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_epochs()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BoolParameter shuffle = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shuffle()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter seed = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_seed()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NetworkUpdateParameters)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NetworkUpdateParameters)
  return false;
#undef DO_
}